

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_suite.cpp
# Opt level: O2

void parser_suite::parse_false(void)

{
  uchar (*in_RDX) [1];
  undefined1 local_3b;
  undefined1 local_3a;
  value_type input [1];
  basic_variable<std::allocator<char>_> result;
  
  input[0] = 0x80;
  trial::protocol::bintoken::parse<unsigned_char[1],std::allocator<char>>
            (&result,(bintoken *)input,in_RDX);
  boost::detail::test_impl
            ("result.same<bool>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x2c,"void parser_suite::parse_false()",result.storage.current == '\x01');
  local_3a = trial::dynamic::basic_variable<std::allocator<char>_>::value<bool>(&result);
  local_3b = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("result.value<bool>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x2d,"void parser_suite::parse_false()",&local_3a,&local_3b);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&result.storage);
  return;
}

Assistant:

void parse_false()
{
    const value_type input[] = { bintoken::token::code::false_value };
    auto result = bintoken::parse(input);
    TRIAL_PROTOCOL_TEST(result.same<bool>());
    TRIAL_PROTOCOL_TEST_EQUAL(result.value<bool>(), false);
}